

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt64
          (OptionInterpreter *this,int number,int64 value,Type type,UnknownFieldSet *unknown_fields)

{
  LogMessage *other;
  int in_ECX;
  int64 in_RDX;
  undefined8 in_RDI;
  uint64 in_R8;
  LogMessage *unaff_retaddr;
  char *in_stack_ffffffffffffff68;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff78;
  LogMessage *in_stack_ffffffffffffff80;
  UnknownFieldSet *in_stack_ffffffffffffff90;
  LogMessage local_60;
  int value_00;
  
  value_00 = (int)((ulong)in_RDI >> 0x20);
  if (in_ECX == 3) {
    UnknownFieldSet::AddVarint(in_stack_ffffffffffffff90,3,(uint64)in_stack_ffffffffffffff80);
  }
  else if (in_ECX == 0x10) {
    UnknownFieldSet::AddFixed64(in_stack_ffffffffffffff90,0x10,(uint64)in_stack_ffffffffffffff80);
  }
  else if (in_ECX == 0x12) {
    internal::WireFormatLite::ZigZagEncode64(in_RDX);
    UnknownFieldSet::AddVarint(in_stack_ffffffffffffff90,in_ECX,in_R8);
  }
  else {
    this_00 = &local_60;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff80,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff78 >> 0x20),(char *)this_00,
               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff68);
    other = internal::LogMessage::operator<<(unaff_retaddr,value_00);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x4b39e6);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt64(
    int number, int64 value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT64:
      unknown_fields->AddVarint(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_SFIXED64:
      unknown_fields->AddFixed64(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_SINT64:
      unknown_fields->AddVarint(
          number, internal::WireFormatLite::ZigZagEncode64(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT64: " << type;
      break;
  }
}